

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void libdef_endmodule(BuildCtx *ctx)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  char line [80];
  char local_88 [88];
  
  if (modstate != 0) {
    if (modstate == 1) {
      fwrite("  (lua_CFunction)0",0x12,1,(FILE *)ctx->fp);
    }
    fwrite("\n};\n",4,1,(FILE *)ctx->fp);
    fprintf((FILE *)ctx->fp,"static const uint8_t %s%s[] = {\n","lj_lib_init_",modname);
    local_88[0] = '\0';
    puVar3 = obuf;
    if (obuf < optr) {
      iVar2 = 0;
      do {
        iVar1 = sprintf(local_88 + iVar2,"%d,",(ulong)*puVar3);
        iVar2 = iVar2 + iVar1;
        if (0x4a < iVar2) {
          iVar2 = 0;
          fprintf((FILE *)ctx->fp,"%s\n",local_88);
          local_88[0] = '\0';
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 < optr);
    }
    fprintf((FILE *)ctx->fp,"%s%d\n};\n#endif\n\n",local_88,0xff);
  }
  return;
}

Assistant:

static void libdef_endmodule(BuildCtx *ctx)
{
  if (modstate != 0) {
    char line[80];
    const uint8_t *p;
    int n;
    if (modstate == 1)
      fprintf(ctx->fp, "  (lua_CFunction)0");
    fprintf(ctx->fp, "\n};\n");
    fprintf(ctx->fp, "static const uint8_t %s%s[] = {\n",
	    LABEL_PREFIX_LIBINIT, modname);
    line[0] = '\0';
    for (n = 0, p = obuf; p < optr; p++) {
      n += sprintf(line+n, "%d,", *p);
      if (n >= 75) {
	fprintf(ctx->fp, "%s\n", line);
	n = 0;
	line[0] = '\0';
      }
    }
    fprintf(ctx->fp, "%s%d\n};\n#endif\n\n", line, LIBINIT_END);
  }
}